

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float ImGui::NavUpdatePageUpPageDown(void)

{
  ImGuiWindow *this;
  ImGuiContext_conflict *pIVar1;
  bool bVar2;
  ImRect *this_00;
  float fVar3;
  float fVar4;
  float fVar5;
  byte local_44;
  byte local_43;
  byte local_42;
  byte local_41;
  float local_40;
  float nav_scoring_rect_offset_y;
  float page_offset_y;
  ImRect *nav_rect_rel;
  bool end_pressed;
  bool home_pressed;
  bool page_down_held;
  bool page_up_held;
  ImGuiWindow *window;
  ImGuiIO_conflict *io;
  ImGuiContext_conflict *g;
  
  pIVar1 = GImGui;
  this = GImGui->NavWindow;
  if ((((this->Flags & 0x40000U) == 0) && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
     (GImGui->NavLayer == ImGuiNavLayer_Main)) {
    bVar2 = IsKeyDown((GImGui->IO).KeyMap[5]);
    local_41 = 0;
    if (bVar2) {
      bVar2 = IsActiveIdUsingKey(5);
      local_41 = bVar2 ^ 0xff;
    }
    bVar2 = IsKeyDown((pIVar1->IO).KeyMap[6]);
    local_42 = 0;
    if (bVar2) {
      bVar2 = IsActiveIdUsingKey(6);
      local_42 = bVar2 ^ 0xff;
    }
    bVar2 = IsKeyPressed((pIVar1->IO).KeyMap[7],true);
    local_43 = 0;
    if (bVar2) {
      bVar2 = IsActiveIdUsingKey(7);
      local_43 = bVar2 ^ 0xff;
    }
    local_43 = local_43 & 1;
    bVar2 = IsKeyPressed((pIVar1->IO).KeyMap[8],true);
    local_44 = 0;
    if (bVar2) {
      bVar2 = IsActiveIdUsingKey(8);
      local_44 = bVar2 ^ 0xff;
    }
    local_44 = local_44 & 1;
    if (((local_41 & 1) == (local_42 & 1)) && (local_43 == local_44)) {
      g._4_4_ = 0.0;
    }
    else if (((this->DC).NavLayersActiveMask == 0) && (((this->DC).NavHasScroll & 1U) != 0)) {
      bVar2 = IsKeyPressed((pIVar1->IO).KeyMap[5],true);
      if (bVar2) {
        fVar4 = (this->Scroll).y;
        fVar3 = ImRect::GetHeight(&this->InnerRect);
        SetScrollY(this,fVar4 - fVar3);
      }
      else {
        bVar2 = IsKeyPressed((pIVar1->IO).KeyMap[6],true);
        if (bVar2) {
          fVar4 = (this->Scroll).y;
          fVar3 = ImRect::GetHeight(&this->InnerRect);
          SetScrollY(this,fVar4 + fVar3);
        }
        else if (local_43 == 0) {
          if (local_44 != 0) {
            SetScrollY(this,(this->ScrollMax).y);
          }
        }
        else {
          SetScrollY(this,0.0);
        }
      }
      g._4_4_ = 0.0;
    }
    else {
      this_00 = this->NavRectRel + pIVar1->NavLayer;
      fVar4 = ImRect::GetHeight(&this->InnerRect);
      fVar3 = ImGuiWindow::CalcFontSize(this);
      fVar5 = ImRect::GetHeight(this_00);
      fVar4 = ImMax<float>(0.0,-fVar3 + fVar4 + fVar5);
      local_40 = 0.0;
      bVar2 = IsKeyPressed((pIVar1->IO).KeyMap[5],true);
      if (bVar2) {
        pIVar1->NavMoveDir = 3;
        pIVar1->NavMoveClipDir = 2;
        pIVar1->NavMoveFlags = 0x30;
        local_40 = -fVar4;
      }
      else {
        bVar2 = IsKeyPressed((pIVar1->IO).KeyMap[6],true);
        if (bVar2) {
          pIVar1->NavMoveDir = 2;
          pIVar1->NavMoveClipDir = 3;
          pIVar1->NavMoveFlags = 0x30;
          local_40 = fVar4;
        }
        else if (local_43 == 0) {
          if (local_44 != 0) {
            fVar4 = ((this->ScrollMax).y + (this->SizeFull).y) - (this->Scroll).y;
            (this_00->Max).y = fVar4;
            (this_00->Min).y = fVar4;
            bVar2 = ImRect::IsInverted(this_00);
            if (bVar2) {
              (this_00->Max).x = 0.0;
              (this_00->Min).x = 0.0;
            }
            pIVar1->NavMoveDir = 2;
            pIVar1->NavMoveFlags = 0x50;
          }
        }
        else {
          fVar4 = -(this->Scroll).y;
          (this_00->Max).y = fVar4;
          (this_00->Min).y = fVar4;
          bVar2 = ImRect::IsInverted(this_00);
          if (bVar2) {
            (this_00->Max).x = 0.0;
            (this_00->Min).x = 0.0;
          }
          pIVar1->NavMoveDir = 3;
          pIVar1->NavMoveFlags = 0x50;
        }
      }
      g._4_4_ = local_40;
    }
  }
  else {
    g._4_4_ = 0.0;
  }
  return g._4_4_;
}

Assistant:

static float ImGui::NavUpdatePageUpPageDown()
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;

    ImGuiWindow* window = g.NavWindow;
    if ((window->Flags & ImGuiWindowFlags_NoNavInputs) || g.NavWindowingTarget != NULL || g.NavLayer != ImGuiNavLayer_Main)
        return 0.0f;

    const bool page_up_held = IsKeyDown(io.KeyMap[ImGuiKey_PageUp]) && !IsActiveIdUsingKey(ImGuiKey_PageUp);
    const bool page_down_held = IsKeyDown(io.KeyMap[ImGuiKey_PageDown]) && !IsActiveIdUsingKey(ImGuiKey_PageDown);
    const bool home_pressed = IsKeyPressed(io.KeyMap[ImGuiKey_Home]) && !IsActiveIdUsingKey(ImGuiKey_Home);
    const bool end_pressed = IsKeyPressed(io.KeyMap[ImGuiKey_End]) && !IsActiveIdUsingKey(ImGuiKey_End);
    if (page_up_held == page_down_held && home_pressed == end_pressed) // Proceed if either (not both) are pressed, otherwise early out
        return 0.0f;

    if (window->DC.NavLayersActiveMask == 0x00 && window->DC.NavHasScroll)
    {
        // Fallback manual-scroll when window has no navigable item
        if (IsKeyPressed(io.KeyMap[ImGuiKey_PageUp], true))
            SetScrollY(window, window->Scroll.y - window->InnerRect.GetHeight());
        else if (IsKeyPressed(io.KeyMap[ImGuiKey_PageDown], true))
            SetScrollY(window, window->Scroll.y + window->InnerRect.GetHeight());
        else if (home_pressed)
            SetScrollY(window, 0.0f);
        else if (end_pressed)
            SetScrollY(window, window->ScrollMax.y);
    }
    else
    {
        ImRect& nav_rect_rel = window->NavRectRel[g.NavLayer];
        const float page_offset_y = ImMax(0.0f, window->InnerRect.GetHeight() - window->CalcFontSize() * 1.0f + nav_rect_rel.GetHeight());
        float nav_scoring_rect_offset_y = 0.0f;
        if (IsKeyPressed(io.KeyMap[ImGuiKey_PageUp], true))
        {
            nav_scoring_rect_offset_y = -page_offset_y;
            g.NavMoveDir = ImGuiDir_Down; // Because our scoring rect is offset up, we request the down direction (so we can always land on the last item)
            g.NavMoveClipDir = ImGuiDir_Up;
            g.NavMoveFlags = ImGuiNavMoveFlags_AllowCurrentNavId | ImGuiNavMoveFlags_AlsoScoreVisibleSet;
        }
        else if (IsKeyPressed(io.KeyMap[ImGuiKey_PageDown], true))
        {
            nav_scoring_rect_offset_y = +page_offset_y;
            g.NavMoveDir = ImGuiDir_Up; // Because our scoring rect is offset down, we request the up direction (so we can always land on the last item)
            g.NavMoveClipDir = ImGuiDir_Down;
            g.NavMoveFlags = ImGuiNavMoveFlags_AllowCurrentNavId | ImGuiNavMoveFlags_AlsoScoreVisibleSet;
        }
        else if (home_pressed)
        {
            // FIXME-NAV: handling of Home/End is assuming that the top/bottom most item will be visible with Scroll.y == 0/ScrollMax.y
            // Scrolling will be handled via the ImGuiNavMoveFlags_ScrollToEdgeY flag, we don't scroll immediately to avoid scrolling happening before nav result.
            // Preserve current horizontal position if we have any.
            nav_rect_rel.Min.y = nav_rect_rel.Max.y = -window->Scroll.y;
            if (nav_rect_rel.IsInverted())
                nav_rect_rel.Min.x = nav_rect_rel.Max.x = 0.0f;
            g.NavMoveDir = ImGuiDir_Down;
            g.NavMoveFlags = ImGuiNavMoveFlags_AllowCurrentNavId | ImGuiNavMoveFlags_ScrollToEdgeY;
            // FIXME-NAV: MoveClipDir left to _None, intentional?
        }
        else if (end_pressed)
        {
            nav_rect_rel.Min.y = nav_rect_rel.Max.y = window->ScrollMax.y + window->SizeFull.y - window->Scroll.y;
            if (nav_rect_rel.IsInverted())
                nav_rect_rel.Min.x = nav_rect_rel.Max.x = 0.0f;
            g.NavMoveDir = ImGuiDir_Up;
            g.NavMoveFlags = ImGuiNavMoveFlags_AllowCurrentNavId | ImGuiNavMoveFlags_ScrollToEdgeY;
            // FIXME-NAV: MoveClipDir left to _None, intentional?
        }
        return nav_scoring_rect_offset_y;
    }
    return 0.0f;
}